

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_vorbis.c
# Opt level: O3

int start_page_no_capturepattern(vorb *f)

{
  uint8 uVar1;
  byte bVar2;
  uint uVar3;
  uint32 uVar4;
  uint32 uVar5;
  uint32 uVar6;
  int iVar7;
  ulong uVar8;
  int iVar9;
  uint8 *puVar10;
  long lVar11;
  
  if ((f->first_decode != '\0') && (f->push_mode == '\0')) {
    uVar3 = stb_vorbis_get_file_offset(f);
    (f->p_first).page_start = uVar3 - 4;
  }
  uVar1 = get8(f);
  if (uVar1 == '\0') {
    uVar1 = get8(f);
    f->page_flag = uVar1;
    uVar4 = get32(f);
    uVar5 = get32(f);
    get32(f);
    uVar6 = get32(f);
    f->last_page = uVar6;
    get32(f);
    bVar2 = get8(f);
    f->segment_count = (uint)bVar2;
    iVar7 = getn(f,f->segments,(uint)bVar2);
    if (iVar7 != 0) {
      f->end_seg_with_known_loc = -2;
      if ((uVar5 & uVar4) != 0xffffffff) {
        uVar8 = (ulong)(uint)f->segment_count;
        puVar10 = f->segments + (uVar8 - 1);
        do {
          if ((int)uVar8 < 1) goto LAB_0018f8b2;
          uVar3 = (int)uVar8 - 1;
          uVar8 = (ulong)uVar3;
          uVar1 = *puVar10;
          puVar10 = puVar10 + -1;
        } while (uVar1 == 0xff);
        f->end_seg_with_known_loc = uVar3;
        f->known_loc_for_packet = uVar4;
      }
LAB_0018f8b2:
      if (f->first_decode != '\0') {
        iVar7 = f->segment_count;
        if ((long)iVar7 < 1) {
          iVar9 = 0x1b;
        }
        else {
          lVar11 = 0;
          iVar9 = 0;
          do {
            iVar9 = iVar9 + (uint)f->segments[lVar11];
            lVar11 = lVar11 + 1;
          } while (iVar7 != lVar11);
          iVar9 = iVar9 + 0x1b;
        }
        (f->p_first).page_end = iVar7 + iVar9 + (f->p_first).page_start;
        (f->p_first).last_decoded_sample = uVar4;
      }
      f->next_seg = 0;
      return 1;
    }
    f->error = VORBIS_unexpected_eof;
  }
  else {
    f->error = VORBIS_invalid_stream_structure_version;
  }
  return 0;
}

Assistant:

static int start_page_no_capturepattern(vorb *f)
{
   uint32 loc0,loc1,n;
   if (f->first_decode && !IS_PUSH_MODE(f)) {
      f->p_first.page_start = stb_vorbis_get_file_offset(f) - 4;
   }
   // stream structure version
   if (0 != get8(f)) return error(f, VORBIS_invalid_stream_structure_version);
   // header flag
   f->page_flag = get8(f);
   // absolute granule position
   loc0 = get32(f);
   loc1 = get32(f);
   // @TODO: validate loc0,loc1 as valid positions?
   // stream serial number -- vorbis doesn't interleave, so discard
   get32(f);
   //if (f->serial != get32(f)) return error(f, VORBIS_incorrect_stream_serial_number);
   // page sequence number
   n = get32(f);
   f->last_page = n;
   // CRC32
   get32(f);
   // page_segments
   f->segment_count = get8(f);
   if (!getn(f, f->segments, f->segment_count))
      return error(f, VORBIS_unexpected_eof);
   // assume we _don't_ know any the sample position of any segments
   f->end_seg_with_known_loc = -2;
   if (loc0 != ~0U || loc1 != ~0U) {
      int i;
      // determine which packet is the last one that will complete
      for (i=f->segment_count-1; i >= 0; --i)
         if (f->segments[i] < 255)
            break;
      // 'i' is now the index of the _last_ segment of a packet that ends
      if (i >= 0) {
         f->end_seg_with_known_loc = i;
         f->known_loc_for_packet   = loc0;
      }
   }
   if (f->first_decode) {
      int i,len;
      len = 0;
      for (i=0; i < f->segment_count; ++i)
         len += f->segments[i];
      len += 27 + f->segment_count;
      f->p_first.page_end = f->p_first.page_start + len;
      f->p_first.last_decoded_sample = loc0;
   }
   f->next_seg = 0;
   return TRUE;
}